

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

bool __thiscall zmq::router_t::xhas_out(router_t *this)

{
  long in_RDI;
  _func_bool_pipe_t_ptr *in_stack_00000018;
  routing_socket_base_t *in_stack_00000020;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x848) & 1) == 0) {
    local_1 = true;
  }
  else {
    local_1 = routing_socket_base_t::any_of_out_pipes<bool(*)(zmq::pipe_t_const&)>
                        (in_stack_00000020,in_stack_00000018);
  }
  return local_1;
}

Assistant:

bool zmq::router_t::xhas_out ()
{
    //  In theory, ROUTER socket is always ready for writing (except when
    //  MANDATORY is set). Whether actual attempt to write succeeds depends
    //  on whitch pipe the message is going to be routed to.

    if (!_mandatory)
        return true;

    return any_of_out_pipes (check_pipe_hwm);
}